

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 iPatternMatch(void *pText,sxu32 nLen,void *pPattern,sxu32 iPatLen,sxu32 *pOfft)

{
  int iVar1;
  int iVar2;
  int d;
  int c;
  char *zPtr2;
  char *zPtr;
  char *zEnd;
  char *zpEnd;
  char *zIn;
  char *zpIn;
  sxu32 *pOfft_local;
  sxu32 iPatLen_local;
  void *pPattern_local;
  sxu32 nLen_local;
  void *pText_local;
  
  zpEnd = (char *)pText;
  if (iPatLen <= nLen) {
    for (; zpEnd < (char *)((long)pText + (ulong)nLen); zpEnd = zpEnd + 1) {
      iVar1 = tolower((int)*zpEnd);
      iVar2 = tolower((int)*pPattern);
      if (iVar1 == iVar2) {
        _d = (char *)((long)pPattern + 1);
        zPtr2 = zpEnd;
        while( true ) {
          zPtr2 = zPtr2 + 1;
          if ((char *)((long)pPattern + (ulong)iPatLen) <= _d) {
            if (pOfft != (sxu32 *)0x0) {
              *pOfft = (int)zpEnd - (int)pText;
            }
            return 0;
          }
          if ((char *)((long)pText + (ulong)nLen) <= zPtr2) break;
          iVar1 = tolower((int)*zPtr2);
          iVar2 = tolower((int)*_d);
          if (iVar1 != iVar2) break;
          _d = _d + 1;
        }
      }
    }
  }
  return -6;
}

Assistant:

static sxi32 iPatternMatch(const void *pText, sxu32 nLen, const void *pPattern, sxu32 iPatLen, sxu32 *pOfft)
{
	const char *zpIn = (const char *)pPattern;
	const char *zIn = (const char *)pText;
	const char *zpEnd = &zpIn[iPatLen];
	const char *zEnd = &zIn[nLen];
	const char *zPtr, *zPtr2;
	int c, d;
	if( iPatLen > nLen ){
		/* Don't bother processing */
		return SXERR_NOTFOUND;
	}
	for(;;){
		if( zIn >= zEnd ){
			break;
		}
		c = SyToLower(zIn[0]);
		d = SyToLower(zpIn[0]);
		if( c == d ){
			zPtr   = &zIn[1];
			zPtr2  = &zpIn[1];
			for(;;){
				if( zPtr2 >= zpEnd ){
					/* Pattern found */
					if( pOfft ){ *pOfft = (sxu32)(zIn-(const char *)pText); }
					return SXRET_OK;
				}
				if( zPtr >= zEnd ){
					break;
				}
				c = SyToLower(zPtr[0]);
				d = SyToLower(zPtr2[0]);
				if( c != d ){
					break;
				}
				zPtr++; zPtr2++;
			}
		}
		zIn++;
	}
	/* Pattern not found */
	return SXERR_NOTFOUND;
}